

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * ApprovalTests::StringUtils::trim(string *__return_storage_ptr__,string *s)

{
  string sStack_78;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,(string *)s);
  leftTrim(&sStack_78,&local_38);
  ::std::__cxx11::string::operator=((string *)s,(string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::string((string *)&local_58,(string *)s);
  rightTrim(&sStack_78,&local_58);
  ::std::__cxx11::string::operator=((string *)s,(string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::trim(std::string s)
    {
        s = leftTrim(s);
        s = rightTrim(s);
        return s;
    }